

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

void __thiscall
array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_>::clear
          (array<CSkins::CSkinPart,_allocator_default<CSkins::CSkinPart>_> *this)

{
  CSkinPart *pCVar1;
  
  allocator_default<CSkins::CSkinPart>::free_array(this->list);
  this->list_size = 1;
  pCVar1 = allocator_default<CSkins::CSkinPart>::alloc_array(1);
  this->list = pCVar1;
  this->num_elements = 0;
  return;
}

Assistant:

void clear()
	{
		ALLOCATOR::free_array(list);
		list_size = 1;
		list = ALLOCATOR::alloc_array(list_size);
		num_elements = 0;
	}